

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

xml_attribute __thiscall pugi::xml_node::append_attribute(xml_node *this,char_t *name_)

{
  xml_node_struct *object;
  xml_attribute xVar1;
  uint uVar2;
  xml_allocator *alloc;
  xml_attribute_struct *pxVar3;
  xml_attribute a;
  xml_attribute local_28;
  xml_attribute local_20;
  
  object = this->_root;
  if ((object != (xml_node_struct *)0x0) &&
     ((uVar2 = (uint)object->header & 0xf, uVar2 == 2 || (uVar2 == 7)))) {
    alloc = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(object);
    pxVar3 = impl::anon_unknown_0::allocate_attribute(alloc);
    xml_attribute::xml_attribute(&local_20,pxVar3);
    if (local_20._attr != (xml_attribute_struct *)0x0) {
      xVar1._attr = this->_root->first_attribute;
      if (xVar1._attr == (xml_attribute_struct *)0x0) {
        this->_root->first_attribute = local_20._attr;
        xVar1._attr = local_20._attr;
      }
      else {
        pxVar3 = (xVar1._attr)->prev_attribute_c;
        pxVar3->next_attribute = local_20._attr;
        (local_20._attr)->prev_attribute_c = pxVar3;
      }
      (xVar1._attr)->prev_attribute_c = local_20._attr;
      xml_attribute::set_name(&local_20,name_);
      return (xml_attribute)local_20._attr;
    }
  }
  xml_attribute::xml_attribute(&local_28);
  return (xml_attribute)local_28._attr;
}

Assistant:

PUGI__FN xml_attribute xml_node::append_attribute(const char_t* name_)
	{
		if (!impl::allow_insert_attribute(type())) return xml_attribute();

		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return xml_attribute();

		xml_attribute a(impl::allocate_attribute(alloc));
		if (!a) return xml_attribute();

		impl::append_attribute(a._attr, _root);

		a.set_name(name_);

		return a;
	}